

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS
ref_interp_enclosing_tri_in_list
          (REF_INTERP ref_interp,REF_LIST ref_list,REF_DBL *xyz,REF_INT *cell,REF_DBL *bary)

{
  REF_INT cell_00;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS RVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  int local_f8;
  uint local_f4;
  double local_f0;
  REF_DBL current_bary [4];
  REF_INT nodes [27];
  
  ref_cell = ref_interp->from_tri;
  ref_node = ref_interp->from_grid->node;
  local_f8 = -1;
  local_f0 = -999.0;
  lVar6 = 0;
  do {
    if (ref_list->n <= lVar6) {
      if (local_f8 == -1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x18d,"ref_interp_enclosing_tri_in_list","failed to find cell");
        RVar4 = 1;
      }
      else {
        *cell = local_f8;
        uVar1 = ref_cell_nodes(ref_cell,local_f8,nodes);
        if (uVar1 == 0) {
          bary[3] = 0.0;
          uVar1 = ref_node_bary3(ref_node,nodes,xyz,bary);
          if (uVar1 == 0) {
            return 0;
          }
          uVar5 = (ulong)uVar1;
          pcVar3 = "bary";
          uVar2 = 0x192;
        }
        else {
          uVar5 = (ulong)uVar1;
          pcVar3 = "cell";
          uVar2 = 400;
        }
LAB_00161f67:
        RVar4 = (REF_STATUS)uVar5;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar2,"ref_interp_enclosing_tri_in_list",uVar5,pcVar3);
      }
      return RVar4;
    }
    cell_00 = ref_list->value[lVar6];
    uVar1 = ref_cell_nodes(ref_cell,cell_00,nodes);
    if (uVar1 != 0) {
      uVar5 = (ulong)uVar1;
      pcVar3 = "cell";
      uVar2 = 0x17f;
      goto LAB_00161f67;
    }
    current_bary[3] = 0.0;
    uVar1 = ref_node_bary3(ref_node,nodes,xyz,current_bary);
    if ((uVar1 & 0xfffffffb) != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x182,"ref_interp_enclosing_tri_in_list",(ulong)uVar1,"bary");
      local_f4 = uVar1;
    }
    if (uVar1 != 4) {
      if (uVar1 != 0) {
        return local_f4;
      }
      dVar7 = current_bary[0];
      if (current_bary[1] <= current_bary[0]) {
        dVar7 = current_bary[1];
      }
      if (current_bary[2] <= dVar7) {
        dVar7 = current_bary[2];
      }
      if ((local_f8 == -1) || (local_f0 < dVar7)) {
        local_f8 = cell_00;
        local_f0 = dVar7;
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_interp_enclosing_tri_in_list(
    REF_INTERP ref_interp, REF_LIST ref_list, REF_DBL *xyz, REF_INT *cell,
    REF_DBL *bary) {
  REF_CELL ref_cell = ref_interp_from_tri(ref_interp);
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, candidate, best_candidate;
  REF_DBL current_bary[4];
  REF_DBL best_bary, min_bary;
  REF_STATUS status;

  best_candidate = REF_EMPTY;
  best_bary = -999.0;
  each_ref_list_item(ref_list, item) {
    candidate = ref_list_value(ref_list, item);
    RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
    current_bary[3] = 0.0;
    status = ref_node_bary3(ref_node, nodes, xyz, current_bary);
    RXS(status, REF_DIV_ZERO, "bary");
    if (REF_SUCCESS == status) { /* exclude REF_DIV_ZERO */

      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }
  }

  RUS(REF_EMPTY, best_candidate, "failed to find cell");

  *cell = best_candidate;
  RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
  bary[3] = 0.0;
  RSS(ref_node_bary3(ref_node, nodes, xyz, bary), "bary");

  return REF_SUCCESS;
}